

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v11::detail::
for_each_codepoint<fmt::v11::detail::compute_width(fmt::v11::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  byte *pbVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  detail *pdVar12;
  detail *pdVar13;
  byte *pbVar14;
  detail *pdVar15;
  string_view sVar16;
  string_view sVar17;
  char buf [7];
  anon_class_8_1_54a39806 decode;
  undefined4 local_48;
  undefined3 uStack_44;
  count_code_points local_40;
  char *local_38;
  
  pcVar8 = s.data_;
  local_40.count = (size_t *)s.size_;
  pcVar9 = pcVar8;
  pdVar15 = this;
  if ((char *)0x3 < pcVar8) {
    local_38 = pcVar8;
    pdVar13 = this;
    do {
      pdVar12 = pdVar13;
      pdVar15 = pdVar12;
      if (this + (long)pcVar8 + -3 <= pdVar12) break;
      uVar7 = (uint)((byte)*pdVar12 >> 3);
      lVar5 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar7];
      uVar10 = ((byte)pdVar12[3] & 0x3f |
               ((byte)pdVar12[2] & 0x3f) << 6 |
               ((byte)pdVar12[1] & 0x3f) << 0xc |
               ((uint)(byte)*pdVar12 & *(uint *)(&DAT_005008a0 + lVar5 * 4)) << 0x12) >>
               ((&DAT_005008e0)[lVar5 * 4] & 0x1f);
      uVar11 = (((byte)pdVar12[1] >> 2 & 0xfffffff0) + (uint)((byte)pdVar12[2] >> 6) * 4 |
                (uint)((byte)pdVar12[3] >> 6) |
                (uint)(uVar10 < *(uint *)(&DAT_005008c0 + lVar5 * 4)) << 6 |
                (uint)(0x10ffff < uVar10) << 8 | (uint)((uVar10 & 0x7ffff800) == 0xd800) << 7) ^
               0x2a;
      if (uVar11 >> ((&DAT_00500900)[lVar5 * 4] & 0x1f) == 0) {
        uVar3 = (ulong)((0x80ff0000U >> uVar7 & 1) != 0);
        pdVar13 = pdVar12 + lVar5 + uVar3;
        sVar2 = uVar3 + lVar5;
      }
      else {
        pdVar13 = pdVar12 + 1;
        sVar2 = 1;
      }
      sVar16.size_ = sVar2;
      sVar16.data_ = (char *)pdVar12;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_40,
                         -(uint)(uVar11 >> ((&DAT_00500900)[lVar5 * 4] & 0x1f) != 0) | uVar10,sVar16
                        );
      if (!bVar1) {
        pdVar13 = (detail *)0x0;
      }
      pdVar15 = (detail *)0x0;
    } while (pdVar13 != (detail *)0x0);
    pcVar9 = local_38;
    if (pdVar12 < this + (long)pcVar8 + -3) {
      return;
    }
  }
  lVar5 = (long)(this + (long)pcVar9) - (long)pdVar15;
  if (lVar5 != 0) {
    lVar4 = 0;
    uStack_44 = 0;
    local_48 = 0;
    do {
      *(detail *)((long)&local_48 + lVar4) = pdVar15[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
    pbVar6 = (byte *)&local_48;
    do {
      uVar7 = (uint)(*pbVar6 >> 3);
      lVar4 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar7];
      uVar10 = (pbVar6[3] & 0x3f |
               (pbVar6[2] & 0x3f) << 6 |
               (pbVar6[1] & 0x3f) << 0xc |
               ((uint)*pbVar6 & *(uint *)(&DAT_005008a0 + lVar4 * 4)) << 0x12) >>
               ((&DAT_005008e0)[lVar4 * 4] & 0x1f);
      uVar11 = ((pbVar6[1] >> 2 & 0xfffffff0) + (uint)(pbVar6[2] >> 6) * 4 | (uint)(pbVar6[3] >> 6)
                | (uint)(uVar10 < *(uint *)(&DAT_005008c0 + lVar4 * 4)) << 6 |
                (uint)(0x10ffff < uVar10) << 8 | (uint)((uVar10 & 0x7ffff800) == 0xd800) << 7) ^
               0x2a;
      if (uVar11 >> ((&DAT_00500900)[lVar4 * 4] & 0x1f) == 0) {
        uVar3 = (ulong)((0x80ff0000U >> uVar7 & 1) != 0);
        pbVar14 = pbVar6 + lVar4 + uVar3;
        sVar2 = uVar3 + lVar4;
      }
      else {
        pbVar14 = pbVar6 + 1;
        sVar2 = 1;
      }
      sVar17.size_ = sVar2;
      sVar17.data_ = (char *)pdVar15;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_40,
                         -(uint)(uVar11 >> ((&DAT_00500900)[lVar4 * 4] & 0x1f) != 0) | uVar10,sVar17
                        );
      if (bVar1) {
        lVar4 = (long)pbVar14 - (long)pbVar6;
      }
      else {
        lVar4 = 0;
      }
      pdVar15 = pdVar15 + lVar4;
    } while ((bVar1) && (pbVar6 = pbVar14, pbVar14 < (byte *)((long)&local_48 + lVar5)));
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, error ? 1 : to_unsigned(end - buf_ptr)));
    return result ? (error ? buf_ptr + 1 : end) : nullptr;
  };

  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  auto num_chars_left = to_unsigned(s.data() + s.size() - p);
  if (num_chars_left == 0) return;

  // Suppress bogus -Wstringop-overflow.
  if (FMT_GCC_VERSION) num_chars_left &= 3;
  char buf[2 * block_size - 1] = {};
  copy<char>(p, p + num_chars_left, buf);
  const char* buf_ptr = buf;
  do {
    auto end = decode(buf_ptr, p);
    if (!end) return;
    p += end - buf_ptr;
    buf_ptr = end;
  } while (buf_ptr < buf + num_chars_left);
}